

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseCallOffset(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  char *pcVar11;
  State copy;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  uVar6 = state->prev_name_length;
  uVar7 = state->nest_level;
  uVar8 = state->append;
  uVar9 = state->overflowed;
  if (*state->mangled_cur == 'h') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar10 = ParseNumber(state,(int *)0x0);
    if ((!bVar10) || (pcVar11 = state->mangled_cur, *pcVar11 != '_')) goto LAB_0012d66c;
LAB_0012d662:
    state->mangled_cur = pcVar11 + 1;
    bVar10 = true;
  }
  else {
LAB_0012d66c:
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    if (*state->mangled_cur == 'v') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar10 = ParseNumber(state,(int *)0x0);
      if ((bVar10) && (*state->mangled_cur == '_')) {
        state->mangled_cur = state->mangled_cur + 1;
        bVar10 = ParseNumber(state,(int *)0x0);
        if ((bVar10) && (pcVar11 = state->mangled_cur, *pcVar11 == '_')) goto LAB_0012d662;
      }
    }
    bVar10 = false;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
  }
  return bVar10;
}

Assistant:

static bool ParseCallOffset(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'h') &&
      ParseNVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'v') &&
      ParseVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  return false;
}